

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseValueType(WastParser *this,Type *out_type)

{
  char cVar1;
  TokenType TVar2;
  Result RVar3;
  char *format;
  long lVar4;
  Type type;
  Token token;
  anon_union_24_4_98baf137_for_Token_2 local_f8;
  undefined1 local_e0 [32];
  size_type *local_c0;
  anon_union_24_4_98baf137_for_Token_2 local_b8;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  TVar2 = Peek(this,0);
  if (TVar2 != First_Type) {
    local_e0._0_8_ = local_e0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"i32","");
    local_c0 = &local_b8.text_.size_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"i64","");
    local_a0[0] = local_90;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"f32","");
    local_80[0] = local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"f64","");
    local_60[0] = local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"v128","");
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"externref","");
    local_f8.text_.data_ = (char *)0x0;
    local_f8.text_.size_ = 0;
    local_f8.literal_.text.size_ = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f8,
               (string *)local_e0,&stack0xffffffffffffffe0);
    lVar4 = 0;
    RVar3 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_f8.text_,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_f8.text_);
    do {
      if (local_30 + lVar4 != *(undefined1 **)((long)local_40 + lVar4)) {
        operator_delete(*(undefined1 **)((long)local_40 + lVar4));
      }
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != -0xc0);
    return (Result)RVar3.enum_;
  }
  Consume((Token *)local_e0,this);
  if (3 < (TokenType)local_c0 - First_Type) {
    __assert_fail("HasType()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/token.h"
                  ,0x67,"Type wabt::Token::type() const");
  }
  local_f8.literal_.type = local_b8.literal_.type;
  if (local_b8.literal_.type + 0x11 < 2) {
    cVar1 = (this->options_->features).reference_types_enabled_;
  }
  else if (local_b8.literal_.type == 0xffffffe8) {
    cVar1 = (this->options_->features).exceptions_enabled_;
  }
  else {
    if (local_b8.literal_.type != ~Nan) goto LAB_00162e7d;
    cVar1 = (this->options_->features).simd_enabled_;
  }
  if (cVar1 == '\0') {
    format = Type::GetName(&local_f8.type_);
    Error(this,0x19b988,format);
    return (Result)Error;
  }
LAB_00162e7d:
  out_type->enum_ = (Enum)local_b8.type_.enum_;
  return (Result)Ok;
}

Assistant:

Result WastParser::ParseValueType(Type* out_type) {
  WABT_TRACE(ParseValueType);
  if (!PeekMatch(TokenType::ValueType)) {
    return ErrorExpected({"i32", "i64", "f32", "f64", "v128", "externref"});
  }

  Token token = Consume();
  Type type = token.type();
  bool is_enabled;
  switch (type) {
    case Type::V128:
      is_enabled = options_->features.simd_enabled();
      break;
    case Type::FuncRef:
    case Type::ExternRef:
      is_enabled = options_->features.reference_types_enabled();
      break;
    case Type::ExnRef:
      is_enabled = options_->features.exceptions_enabled();
      break;
    default:
      is_enabled = true;
      break;
  }

  if (!is_enabled) {
    Error(token.loc, "value type not allowed: %s", type.GetName());
    return Result::Error;
  }

  *out_type = type;
  return Result::Ok;
}